

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

TEXTURE_FORMAT Diligent::UnormFormatToSRGB(TEXTURE_FORMAT Fmt)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,Fmt);
  switch(iVar1) {
  case 0x62:
    return TEX_FORMAT_BC7_UNORM_SRGB;
  case 99:
  case 0x65:
  case 0x67:
    goto switchD_0060cccd_caseD_63;
  case 100:
    return TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
  case 0x66:
    return TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
  case 0x68:
    return TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  default:
    if (iVar1 == 0x1c) {
      return TEX_FORMAT_RGBA8_UNORM_SRGB;
    }
    if (iVar1 == 0x58) {
      return TEX_FORMAT_BGRX8_UNORM_SRGB;
    }
    if (iVar1 == 0x4a) {
      return TEX_FORMAT_BC2_UNORM_SRGB;
    }
    if (iVar1 == 0x4d) {
      return TEX_FORMAT_BC3_UNORM_SRGB;
    }
    if (iVar1 == 0x57) {
      return TEX_FORMAT_BGRA8_UNORM_SRGB;
    }
    if (iVar1 == 0x47) {
      iVar1 = 0x48;
    }
switchD_0060cccd_caseD_63:
    return (TEXTURE_FORMAT)iVar1;
  }
}

Assistant:

TEXTURE_FORMAT UnormFormatToSRGB(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_UNORM:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        case TEX_FORMAT_BC1_UNORM:
            return TEX_FORMAT_BC1_UNORM_SRGB;

        case TEX_FORMAT_BC2_UNORM:
            return TEX_FORMAT_BC2_UNORM_SRGB;

        case TEX_FORMAT_BC3_UNORM:
            return TEX_FORMAT_BC3_UNORM_SRGB;

        case TEX_FORMAT_BGRA8_UNORM:
            return TEX_FORMAT_BGRA8_UNORM_SRGB;

        case TEX_FORMAT_BGRX8_UNORM:
            return TEX_FORMAT_BGRX8_UNORM_SRGB;

        case TEX_FORMAT_BC7_UNORM:
            return TEX_FORMAT_BC7_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGB8_UNORM:
            return TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGB8A1_UNORM:
            return TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGBA8_UNORM:
            return TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;

        default:
            return Fmt;
    }
}